

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomLayoutItem::read(DomLayoutItem *this,int __fd,void *__buf,size_t __nbytes)

{
  QStringView other;
  QStringView other_00;
  QStringView other_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  const_iterator o;
  size_t sVar4;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  DomSpacer *v_2;
  DomLayout *v_1;
  DomWidget *v;
  QXmlStreamAttribute *attribute;
  QXmlStreamAttributes *__range1;
  QXmlStreamAttributes *attributes;
  QStringView tag;
  QStringView name;
  const_iterator __end1;
  const_iterator __begin1;
  DomWidget *in_stack_fffffffffffffce8;
  DomWidget *in_stack_fffffffffffffcf0;
  undefined7 in_stack_fffffffffffffcf8;
  byte in_stack_fffffffffffffcff;
  DomLayout *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  byte in_stack_fffffffffffffd0f;
  DomWidget *in_stack_fffffffffffffd10;
  uint in_stack_fffffffffffffd18;
  const_iterator local_28 [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QXmlStreamReader::attributes();
  local_28[0].i = (QXmlStreamAttribute *)0xaaaaaaaaaaaaaaaa;
  local_28[0] = QList<QXmlStreamAttribute>::begin
                          ((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffcf0);
  o = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)in_stack_fffffffffffffcf0);
  while (bVar1 = QList<QXmlStreamAttribute>::const_iterator::operator!=(local_28,o), bVar1) {
    QList<QXmlStreamAttribute>::const_iterator::operator*(local_28);
    QXmlStreamAttribute::name((QXmlStreamAttribute *)0x1ae4f5);
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
               (size_t)in_stack_fffffffffffffd00);
    QStringView::QStringView<QString,_true>
              ((QStringView *)in_stack_fffffffffffffd00,
               (QString *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
    bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffcf0,
                         (QStringView *)in_stack_fffffffffffffce8);
    QString::~QString((QString *)0x1ae559);
    if (bVar1) {
      QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1ae56d);
      iVar2 = QStringView::toInt((QStringView *)
                                 CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                                 (bool *)in_stack_fffffffffffffcf0,
                                 (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
      setAttributeRow(this,iVar2);
    }
    else {
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                 (size_t)in_stack_fffffffffffffd00);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffffd00,
                 (QString *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
      bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffcf0,
                           (QStringView *)in_stack_fffffffffffffce8);
      QString::~QString((QString *)0x1ae5f8);
      if (bVar1) {
        QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1ae60c);
        iVar2 = QStringView::toInt((QStringView *)
                                   CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                                   (bool *)in_stack_fffffffffffffcf0,
                                   (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
        setAttributeColumn(this,iVar2);
      }
      else {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                   (size_t)in_stack_fffffffffffffd00);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffd00,
                   (QString *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
        bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffcf0,
                             (QStringView *)in_stack_fffffffffffffce8);
        QString::~QString((QString *)0x1ae697);
        if (bVar1) {
          QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1ae6ab);
          iVar2 = QStringView::toInt((QStringView *)
                                     CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                                     (bool *)in_stack_fffffffffffffcf0,
                                     (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
          setAttributeRowSpan(this,iVar2);
        }
        else {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                     (size_t)in_stack_fffffffffffffd00);
          QStringView::QStringView<QString,_true>
                    ((QStringView *)in_stack_fffffffffffffd00,
                     (QString *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
          bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffcf0,
                               (QStringView *)in_stack_fffffffffffffce8);
          QString::~QString((QString *)0x1ae736);
          if (bVar1) {
            QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1ae74a);
            iVar2 = QStringView::toInt((QStringView *)
                                       CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8)
                                       ,(bool *)in_stack_fffffffffffffcf0,
                                       (int)((ulong)in_stack_fffffffffffffce8 >> 0x20));
            setAttributeColSpan(this,iVar2);
          }
          else {
            Qt::Literals::StringLiterals::operator____s
                      ((char16_t *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                       (size_t)in_stack_fffffffffffffd00);
            QStringView::QStringView<QString,_true>
                      ((QStringView *)in_stack_fffffffffffffd00,
                       (QString *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
            bVar1 = ::operator==((QStringView *)in_stack_fffffffffffffcf0,
                                 (QStringView *)in_stack_fffffffffffffce8);
            QString::~QString((QString *)0x1ae7d5);
            if (bVar1) {
              QXmlStreamAttribute::value((QXmlStreamAttribute *)0x1ae7e9);
              QStringView::toString((QStringView *)in_stack_fffffffffffffcf0);
              setAttributeAlignment
                        ((DomLayoutItem *)in_stack_fffffffffffffcf0,
                         &in_stack_fffffffffffffce8->m_attr_class);
              QString::~QString((QString *)0x1ae82d);
            }
            else {
              Qt::Literals::StringLiterals::operator____L1
                        ((char *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                         (size_t)in_stack_fffffffffffffcf0);
              ::operator+((QLatin1String *)in_stack_fffffffffffffcf0,
                          (QStringView *)in_stack_fffffffffffffce8);
              ::QStringBuilder::operator_cast_to_QString
                        ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                         in_stack_fffffffffffffce8);
              QXmlStreamReader::raiseError((QString *)CONCAT44(in_register_00000034,__fd));
              QString::~QString((QString *)0x1ae8ae);
            }
          }
        }
      }
    }
    QList<QXmlStreamAttribute>::const_iterator::operator++(local_28);
  }
  do {
    while( true ) {
      bVar1 = QXmlStreamReader::hasError((QXmlStreamReader *)0x1ae8cf);
      if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_001aec31;
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 != 4) break;
      QXmlStreamReader::name();
      Qt::Literals::StringLiterals::operator____s
                ((char16_t *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                 (size_t)in_stack_fffffffffffffd00);
      QStringView::QStringView<QString,_true>
                ((QStringView *)in_stack_fffffffffffffd00,
                 (QString *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
      sVar4 = 0;
      other.m_data._0_4_ = in_stack_fffffffffffffd18;
      other.m_size = (qsizetype)in_stack_fffffffffffffd10;
      other.m_data._4_4_ = iVar2;
      iVar3 = QStringView::compare((QStringView *)in_stack_fffffffffffffce8,other,CaseInsensitive);
      in_stack_fffffffffffffd18 = CONCAT13(iVar3 != 0,(int3)in_stack_fffffffffffffd18) ^ 0xff000000;
      QString::~QString((QString *)0x1ae9a7);
      if ((in_stack_fffffffffffffd18 & 0x1000000) == 0) {
        Qt::Literals::StringLiterals::operator____s
                  ((char16_t *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                   (size_t)in_stack_fffffffffffffd00);
        QStringView::QStringView<QString,_true>
                  ((QStringView *)in_stack_fffffffffffffd00,
                   (QString *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
        sVar4 = 0;
        other_00.m_data._0_4_ = in_stack_fffffffffffffd18;
        other_00.m_size = (qsizetype)in_stack_fffffffffffffd10;
        other_00.m_data._4_4_ = iVar2;
        iVar3 = QStringView::compare
                          ((QStringView *)in_stack_fffffffffffffce8,other_00,CaseInsensitive);
        in_stack_fffffffffffffd0f = iVar3 != 0 ^ 0xff;
        QString::~QString((QString *)0x1aea6f);
        if ((in_stack_fffffffffffffd0f & 1) == 0) {
          Qt::Literals::StringLiterals::operator____s
                    ((char16_t *)CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                     (size_t)in_stack_fffffffffffffd00);
          QStringView::QStringView<QString,_true>
                    ((QStringView *)in_stack_fffffffffffffd00,
                     (QString *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8));
          sVar4 = 0;
          other_01.m_data._0_4_ = in_stack_fffffffffffffd18;
          other_01.m_size = (qsizetype)in_stack_fffffffffffffd10;
          other_01.m_data._4_4_ = iVar2;
          iVar2 = QStringView::compare
                            ((QStringView *)in_stack_fffffffffffffce8,other_01,CaseInsensitive);
          in_stack_fffffffffffffcff = iVar2 != 0 ^ 0xff;
          QString::~QString((QString *)0x1aeb37);
          if ((in_stack_fffffffffffffcff & 1) == 0) {
            in_stack_fffffffffffffce8 = (DomWidget *)CONCAT44(in_register_00000034,__fd);
            Qt::Literals::StringLiterals::operator____L1
                      ((char *)CONCAT17(in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8),
                       (size_t)in_stack_fffffffffffffcf0);
            ::operator+((QLatin1String *)in_stack_fffffffffffffcf0,
                        (QStringView *)in_stack_fffffffffffffce8);
            ::QStringBuilder::operator_cast_to_QString
                      ((QStringBuilder<QLatin1String,_const_QStringView_&> *)
                       in_stack_fffffffffffffce8);
            QXmlStreamReader::raiseError(&in_stack_fffffffffffffce8->m_attr_class);
            QString::~QString((QString *)0x1aec16);
          }
          else {
            in_stack_fffffffffffffcf0 = (DomWidget *)operator_new(0x38);
            memset(in_stack_fffffffffffffcf0,0,0x38);
            DomSpacer::DomSpacer((DomSpacer *)in_stack_fffffffffffffcf0);
            DomSpacer::read((DomSpacer *)in_stack_fffffffffffffcf0,__fd,__buf_02,sVar4);
            setElementSpacer((DomLayoutItem *)in_stack_fffffffffffffcf0,
                             (DomSpacer *)in_stack_fffffffffffffce8);
          }
        }
        else {
          in_stack_fffffffffffffd00 = (DomLayout *)operator_new(0x128);
          memset(in_stack_fffffffffffffd00,0,0x128);
          DomLayout::DomLayout((DomLayout *)in_stack_fffffffffffffcf0);
          DomLayout::read(in_stack_fffffffffffffd00,__fd,__buf_01,sVar4);
          setElementLayout((DomLayoutItem *)in_stack_fffffffffffffcf0,
                           (DomLayout *)in_stack_fffffffffffffce8);
        }
      }
      else {
        in_stack_fffffffffffffd10 = (DomWidget *)operator_new(0x160);
        memset(in_stack_fffffffffffffd10,0,0x160);
        DomWidget::DomWidget(in_stack_fffffffffffffcf0);
        DomWidget::read(in_stack_fffffffffffffd10,__fd,__buf_00,sVar4);
        setElementWidget((DomLayoutItem *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      }
    }
  } while (iVar2 != 5);
LAB_001aec31:
  QXmlStreamAttributes::~QXmlStreamAttributes((QXmlStreamAttributes *)0x1aec3e);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomLayoutItem::read(QXmlStreamReader &reader)
{
    const QXmlStreamAttributes &attributes = reader.attributes();
    for (const QXmlStreamAttribute &attribute : attributes) {
        const auto name = attribute.name();
        if (name == u"row"_s) {
            setAttributeRow(attribute.value().toInt());
            continue;
        }
        if (name == u"column"_s) {
            setAttributeColumn(attribute.value().toInt());
            continue;
        }
        if (name == u"rowspan"_s) {
            setAttributeRowSpan(attribute.value().toInt());
            continue;
        }
        if (name == u"colspan"_s) {
            setAttributeColSpan(attribute.value().toInt());
            continue;
        }
        if (name == u"alignment"_s) {
            setAttributeAlignment(attribute.value().toString());
            continue;
        }
        reader.raiseError("Unexpected attribute "_L1 + name);
    }

    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"widget"_s, Qt::CaseInsensitive)) {
                auto *v = new DomWidget();
                v->read(reader);
                setElementWidget(v);
                continue;
            }
            if (!tag.compare(u"layout"_s, Qt::CaseInsensitive)) {
                auto *v = new DomLayout();
                v->read(reader);
                setElementLayout(v);
                continue;
            }
            if (!tag.compare(u"spacer"_s, Qt::CaseInsensitive)) {
                auto *v = new DomSpacer();
                v->read(reader);
                setElementSpacer(v);
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}